

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O2

ChMatrix33<double> *
chrono::fea::rotutils::DRot_IT(ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *phi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double coeffs [1];
  double coeff [4];
  ChStarMatrix33<double> pxpx;
  ChMatrix33<double> Eye;
  double local_160;
  ChVector<double> local_158;
  ChStarMatrix33<double> *local_138;
  double local_128 [4];
  ChStarMatrix33<double> local_108;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  double local_a8;
  undefined8 local_a0;
  ulong local_98;
  ulong uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  ChMatrix33<double> local_78;
  
  CoeffCStar<chrono::ChVector<double>,double>(phi,phi,local_128,&local_160);
  ChMatrix33<double>::ChMatrix33(&local_78,1.0);
  local_a8 = phi->m_data[2] * 0.5;
  local_c0 = 0;
  auVar2._0_8_ = -local_a8;
  auVar2._8_8_ = 0x8000000000000000;
  local_b8 = vmovlpd_avx(auVar2);
  local_a0 = 0;
  auVar2 = *(undefined1 (*) [16])phi->m_data;
  auVar1._8_8_ = 0x3fe0000000000000;
  auVar1._0_8_ = 0x3fe0000000000000;
  auVar1 = vmulpd_avx512vl(auVar2,auVar1);
  local_98 = auVar1._0_8_ ^ 0x8000000000000000;
  uStack_90 = auVar1._8_8_ ^ 0x8000000000000000;
  local_b0 = vmovhpd_avx(auVar1);
  local_88 = vmovlpd_avx(auVar1);
  local_80 = 0;
  local_158.m_data[0] = auVar2._0_8_ * local_160;
  local_158.m_data[1] = auVar2._8_8_ * local_160;
  local_158.m_data[2] = phi->m_data[2] * local_160;
  ChStarMatrix33<double>::ChStarMatrix33(&local_108,phi,&local_158);
  local_158.m_data[1] = (double)&local_78;
  local_158.m_data[2] = (double)&local_c0;
  local_138 = &local_108;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> DRot_IT(const ChVector<>& phi) {
    double coeff[COEFF_D], coeffs[COEFF_C_STAR];

    CoeffCStar(phi, phi, coeff, coeffs);

    ChMatrix33<> Eye(1);
    ChStarMatrix33<> Phix(phi * 0.5);
    ChStarMatrix33<> pxpx(phi, phi * coeffs[0]);

    return Eye + Phix + pxpx;
}